

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O0

void __thiscall iutest_typed_test_suite_p_name_DISABLED_TypedPFoo_::Bar<int>::Body(Bar<int> *this)

{
  AssertionHelper local_1c8;
  Fixed local_198;
  Bar<int> *local_10;
  Bar<int> *this_local;
  
  local_10 = this;
  memset(&local_198,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_198);
  iutest::AssertionHelper::AssertionHelper
            (&local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/disabled_tests_decl.cpp"
             ,0x92,"Failed.\n",kFatalFailure);
  iutest::AssertionHelper::operator=(&local_1c8,&local_198);
  iutest::AssertionHelper::~AssertionHelper(&local_1c8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_198);
  return;
}

Assistant:

IUTEST_TYPED_TEST_P(DISABLED_TypedPFoo, Bar)
{
    IUTEST_FAIL();
}